

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void opj_image_comp_header_update(opj_image_t *p_image_header,opj_cp_v2 *p_cp)

{
  int a;
  int a_00;
  int a_01;
  int a_02;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RSI;
  int *in_RDI;
  opj_image_comp_t *l_img_comp;
  OPJ_INT32 l_comp_y1;
  OPJ_INT32 l_comp_x1;
  OPJ_INT32 l_comp_y0;
  OPJ_INT32 l_comp_x0;
  OPJ_INT32 l_y1;
  OPJ_INT32 l_x1;
  OPJ_INT32 l_y0;
  OPJ_INT32 l_x0;
  OPJ_UINT32 l_height;
  OPJ_UINT32 l_width;
  OPJ_UINT32 i;
  int *local_48;
  uint local_14;
  
  a = int_max(*(int *)(in_RSI + 4),*in_RDI);
  a_00 = int_max(*(int *)(in_RSI + 8),in_RDI[1]);
  a_01 = int_min(*(int *)(in_RSI + 4) + *(int *)(in_RSI + 0x20) * *(int *)(in_RSI + 0xc),in_RDI[2]);
  a_02 = int_min(*(int *)(in_RSI + 8) + *(int *)(in_RSI + 0x24) * *(int *)(in_RSI + 0x10),in_RDI[3])
  ;
  local_48 = *(int **)(in_RDI + 6);
  for (local_14 = 0; local_14 < (uint)in_RDI[4]; local_14 = local_14 + 1) {
    iVar1 = int_ceildiv(a,*local_48);
    iVar2 = int_ceildiv(a_00,local_48[1]);
    iVar3 = int_ceildiv(a_01,*local_48);
    iVar4 = int_ceildiv(a_02,local_48[1]);
    iVar3 = int_ceildivpow2(iVar3 - iVar1,local_48[10]);
    iVar4 = int_ceildivpow2(iVar4 - iVar2,local_48[10]);
    local_48[2] = iVar3;
    local_48[3] = iVar4;
    local_48[4] = iVar1;
    local_48[5] = iVar2;
    local_48 = local_48 + 0xe;
  }
  return;
}

Assistant:

void opj_image_comp_header_update(opj_image_t * p_image_header, const struct opj_cp_v2 * p_cp)
{
	OPJ_UINT32 i, l_width, l_height;
	OPJ_INT32 l_x0, l_y0, l_x1, l_y1;
	OPJ_INT32 l_comp_x0, l_comp_y0, l_comp_x1, l_comp_y1;
	opj_image_comp_t* l_img_comp = NULL;

	l_x0 = int_max(p_cp->tx0 , p_image_header->x0);
	l_y0 = int_max(p_cp->ty0 , p_image_header->y0);
	l_x1 = int_min(p_cp->tx0 + p_cp->tw * p_cp->tdx, p_image_header->x1);
	l_y1 = int_min(p_cp->ty0 + p_cp->th * p_cp->tdy, p_image_header->y1);

	l_img_comp = p_image_header->comps;
	for	(i = 0; i < p_image_header->numcomps; ++i) {
		l_comp_x0 = int_ceildiv(l_x0, l_img_comp->dx);
		l_comp_y0 = int_ceildiv(l_y0, l_img_comp->dy);
		l_comp_x1 = int_ceildiv(l_x1, l_img_comp->dx);
		l_comp_y1 = int_ceildiv(l_y1, l_img_comp->dy);
		l_width = int_ceildivpow2(l_comp_x1 - l_comp_x0, l_img_comp->factor);
		l_height = int_ceildivpow2(l_comp_y1 - l_comp_y0, l_img_comp->factor);
		l_img_comp->w = l_width;
		l_img_comp->h = l_height;
		l_img_comp->x0 = l_comp_x0/*l_x0*/;
		l_img_comp->y0 = l_comp_y0/*l_y0*/;
		++l_img_comp;
	}
}